

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::SwapCoordinates(ON_NurbsSurface *this,int i,int j)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  bool bVar7;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar2 = this->m_cv_count[0];
  iVar4 = this->m_cv_count[1];
  bVar7 = true;
  iVar6 = 0;
  if (iVar4 < iVar2) {
    for (; iVar6 < iVar4; iVar6 = iVar6 + 1) {
      uVar3 = this->m_cv_stride[1] * iVar6;
      pdVar5 = this->m_cv + uVar3;
      if ((int)uVar3 < 0) {
        pdVar5 = (double *)0x0;
      }
      if (this->m_cv == (double *)0x0) {
        pdVar5 = (double *)0x0;
      }
      bVar1 = ON_SwapPointListCoordinates(this->m_cv_count[0],this->m_cv_stride[0],pdVar5,i,j);
      bVar7 = (bool)(bVar7 & bVar1);
      iVar4 = this->m_cv_count[1];
    }
  }
  else {
    for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      uVar3 = this->m_cv_stride[0] * iVar6;
      pdVar5 = this->m_cv + uVar3;
      if ((int)uVar3 < 0) {
        pdVar5 = (double *)0x0;
      }
      if (this->m_cv == (double *)0x0) {
        pdVar5 = (double *)0x0;
      }
      bVar1 = ON_SwapPointListCoordinates(this->m_cv_count[1],this->m_cv_stride[1],pdVar5,i,j);
      bVar7 = (bool)(bVar7 & bVar1);
      iVar2 = this->m_cv_count[0];
    }
  }
  return bVar7;
}

Assistant:

bool
ON_NurbsSurface::SwapCoordinates( int i, int j )
{
  DestroySurfaceTree();
  bool rc = true;
  int k;
  if ( m_cv_count[0] <= m_cv_count[1] ) {
    for ( k = 0; k < m_cv_count[0]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[1], m_cv_stride[1], CV(k,0), i, j ) )
        rc = false;
    }
  }
  else {
    for ( k = 0; k < m_cv_count[1]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[0], m_cv_stride[0], CV(0,k), i, j ) )
        rc = false;
    }
  }
  return rc;
}